

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_ibcast_(void *buffer,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *root,
                   MPIABI_Fint *comm,MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  MPIABI_Fint *request_local;
  MPIABI_Fint *comm_local;
  MPIABI_Fint *root_local;
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *count_local;
  void *buffer_local;
  
  mpi_ibcast_(buffer,count,datatype,root,comm,request,ierror);
  return;
}

Assistant:

void mpiabi_ibcast_(
  void * buffer,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ibcast_(
    buffer,
    count,
    datatype,
    root,
    comm,
    request,
    ierror
  );
}